

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.h
# Opt level: O2

void __thiscall CScheduler::stop(CScheduler *this)

{
  long in_FS_OFFSET;
  anon_class_8_1_8991fb9c local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.this = this;
  stop::anon_class_8_1_8991fb9c::operator()(&local_18);
  std::condition_variable::notify_all();
  if ((this->m_service_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void stop() EXCLUSIVE_LOCKS_REQUIRED(!newTaskMutex)
    {
        WITH_LOCK(newTaskMutex, stopRequested = true);
        newTaskScheduled.notify_all();
        if (m_service_thread.joinable()) m_service_thread.join();
    }